

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.cpp
# Opt level: O0

void __thiscall
Descriptor_Parse_sh_multi_Test::~Descriptor_Parse_sh_multi_Test
          (Descriptor_Parse_sh_multi_Test *this)

{
  Descriptor_Parse_sh_multi_Test *this_local;
  
  ~Descriptor_Parse_sh_multi_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(Descriptor, Parse_sh_multi) {
  std::string descriptor = "sh(multi(2,022f01e5e15cca351daff3843fb70f3c2f0a1bdd05e5af888a67784ef3e10a2a01,03acd484e2f0c7f65309ad178a9f559abde09796974c57e714c35f110dfc27ccbe))";
  Descriptor desc;
  Script locking_script;
  std::string desc_str = "";
  std::vector<DescriptorScriptReference> script_list;

  EXPECT_NO_THROW(desc = Descriptor::Parse(descriptor));
  EXPECT_NO_THROW(locking_script = desc.GetLockingScript());
  EXPECT_NO_THROW(desc_str = desc.ToString(false));
  EXPECT_NO_THROW(script_list = desc.GetReferenceAll());
  EXPECT_STREQ(desc_str.c_str(), descriptor.c_str());
  EXPECT_STREQ(locking_script.ToString().c_str(),
      "OP_HASH160 a6a8b030a38762f4c1f5cbe387b61a3c5da5cd26 OP_EQUAL");
  EXPECT_EQ(script_list.size(), 1);
  if (script_list.size() == 1) {
    EXPECT_STREQ(script_list[0].GetRedeemScript().ToString().c_str(),
        "2 022f01e5e15cca351daff3843fb70f3c2f0a1bdd05e5af888a67784ef3e10a2a01 03acd484e2f0c7f65309ad178a9f559abde09796974c57e714c35f110dfc27ccbe 2 OP_CHECKMULTISIG");
    EXPECT_TRUE(script_list[0].GetChild().HasReqNum());
    EXPECT_EQ(script_list[0].GetChild().GetReqNum(), 2);
  }
}